

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

void mh_free(AD *ad)

{
  char *emsg;
  TableData in_RDI;
  ErrorType unaff_retaddr;
  ErrorLevel unaff_retaddr_00;
  Integer memhandle;
  
  emsg = (char *)ma_table_lookup_assoc(in_RDI);
  if (emsg == (char *)0xffffffffffffffff) {
    sprintf(ma_ebuf,"cannot find memhandle for block address 0x%lx",in_RDI);
    ma_error(unaff_retaddr_00,unaff_retaddr,in_RDI,emsg);
  }
  else {
    ma_table_deallocate(0x106c8e);
  }
  return;
}

Assistant:

private void mh_free(ad)
    AD        *ad;        /* the AD whose memhandle to free */
{
    Integer    memhandle;    /* memhandle for AD */

    /* convert AD to memhandle */
    if ((memhandle = ma_table_lookup_assoc((TableData)ad)) == TABLE_HANDLE_NONE)
    {
        (void)sprintf(ma_ebuf,
            "cannot find memhandle for block address 0x%lx",
            (size_t)ad);
        ma_error(EL_Nonfatal, ET_Internal, "mh_free", ma_ebuf);
    }
    else
        /* free memhandle */
        ma_table_deallocate(memhandle);
}